

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O1

int __thiscall
btDbvt::clone(btDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btDbvtNode *pbVar3;
  btDbvtNode *pbVar4;
  btDbvtNode *pbVar5;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  btScalar bVar12;
  undefined8 uVar13;
  int extraout_EAX;
  int extraout_EAX_00;
  sStkCLN *psVar14;
  btDbvtNode *pbVar15;
  btDbvtNode **ppbVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  btAlignedObjectArray<btDbvt::sStkCLN> stack;
  btAlignedObjectArray<btDbvt::sStkCLN> bStack_58;
  long *local_38;
  
  local_38 = (long *)__child_stack;
  clear((btDbvt *)__fn);
  iVar18 = extraout_EAX;
  if (this->m_root != (btDbvtNode *)0x0) {
    bStack_58.m_ownsMemory = true;
    bStack_58.m_data = (sStkCLN *)0x0;
    bStack_58.m_size = 0;
    bStack_58.m_capacity = 0;
    iVar18 = this->m_leaves;
    psVar14 = bStack_58.m_data;
    iVar19 = bStack_58.m_capacity;
    if (0 < (long)iVar18) {
      psVar14 = (sStkCLN *)btAlignedAllocInternal((long)iVar18 << 4,0x10);
      if (0 < (long)bStack_58.m_size) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar17);
          uVar13 = puVar1[1];
          puVar2 = (undefined8 *)((long)&psVar14->node + lVar17);
          *puVar2 = *puVar1;
          puVar2[1] = uVar13;
          lVar17 = lVar17 + 0x10;
        } while ((long)bStack_58.m_size * 0x10 != lVar17);
      }
      iVar19 = iVar18;
      if ((bStack_58.m_data != (sStkCLN *)0x0) && (bStack_58.m_ownsMemory == true)) {
        btAlignedFreeInternal(bStack_58.m_data);
      }
    }
    bStack_58.m_capacity = iVar19;
    bStack_58.m_data = psVar14;
    bStack_58.m_ownsMemory = true;
    pbVar3 = this->m_root;
    psVar14 = bStack_58.m_data;
    iVar18 = bStack_58.m_capacity;
    if (bStack_58.m_size == bStack_58.m_capacity) {
      iVar19 = 1;
      if (bStack_58.m_size != 0) {
        iVar19 = bStack_58.m_size * 2;
      }
      if (bStack_58.m_capacity < iVar19) {
        if (iVar19 == 0) {
          psVar14 = (sStkCLN *)0x0;
        }
        else {
          psVar14 = (sStkCLN *)btAlignedAllocInternal((long)iVar19 << 4,0x10);
        }
        if (0 < (long)bStack_58.m_size) {
          lVar17 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar17);
            uVar13 = puVar1[1];
            puVar2 = (undefined8 *)((long)&psVar14->node + lVar17);
            *puVar2 = *puVar1;
            puVar2[1] = uVar13;
            lVar17 = lVar17 + 0x10;
          } while ((long)bStack_58.m_size * 0x10 != lVar17);
        }
        iVar18 = iVar19;
        if ((bStack_58.m_data != (sStkCLN *)0x0) && (bStack_58.m_ownsMemory == true)) {
          btAlignedFreeInternal(bStack_58.m_data);
        }
      }
    }
    bStack_58.m_capacity = iVar18;
    bStack_58.m_data = psVar14;
    bStack_58.m_ownsMemory = true;
    lVar17 = (long)bStack_58.m_size;
    bStack_58.m_size = bStack_58.m_size + 1;
    bStack_58.m_data[lVar17].node = pbVar3;
    bStack_58.m_data[lVar17].parent = (btDbvtNode *)0x0;
    do {
      lVar17 = (long)bStack_58.m_size + -1;
      pbVar3 = bStack_58.m_data[lVar17].node;
      pbVar4 = bStack_58.m_data[lVar17].parent;
      pbVar5 = (pbVar3->field_2).childs[0];
      pbVar15 = *(btDbvtNode **)(__fn + 8);
      if (pbVar15 == (btDbvtNode *)0x0) {
        pbVar15 = (btDbvtNode *)btAlignedAllocInternal(0x38,0x10);
        pbVar15->parent = (btDbvtNode *)0x0;
        (pbVar15->field_2).childs[0] = (btDbvtNode *)0x0;
        (pbVar15->volume).mx.m_floats[0] = 0.0;
        (pbVar15->volume).mx.m_floats[1] = 0.0;
        (pbVar15->volume).mx.m_floats[2] = 0.0;
        (pbVar15->volume).mx.m_floats[3] = 0.0;
        (pbVar15->volume).mi.m_floats[0] = 0.0;
        (pbVar15->volume).mi.m_floats[1] = 0.0;
        (pbVar15->volume).mi.m_floats[2] = 0.0;
        (pbVar15->volume).mi.m_floats[3] = 0.0;
        (pbVar15->field_2).childs[1] = (btDbvtNode *)0x0;
      }
      else {
        *(undefined8 *)(__fn + 8) = 0;
      }
      pbVar15->parent = pbVar4;
      (pbVar15->field_2).childs[0] = pbVar5;
      (pbVar15->field_2).childs[1] = (btDbvtNode *)0x0;
      bVar6 = (pbVar3->volume).mi.m_floats[1];
      bVar7 = (pbVar3->volume).mi.m_floats[2];
      bVar8 = (pbVar3->volume).mi.m_floats[3];
      bVar9 = (pbVar3->volume).mx.m_floats[0];
      bVar10 = (pbVar3->volume).mx.m_floats[1];
      bVar11 = (pbVar3->volume).mx.m_floats[2];
      bVar12 = (pbVar3->volume).mx.m_floats[3];
      (pbVar15->volume).mi.m_floats[0] = (pbVar3->volume).mi.m_floats[0];
      (pbVar15->volume).mi.m_floats[1] = bVar6;
      (pbVar15->volume).mi.m_floats[2] = bVar7;
      (pbVar15->volume).mi.m_floats[3] = bVar8;
      (pbVar15->volume).mx.m_floats[0] = bVar9;
      (pbVar15->volume).mx.m_floats[1] = bVar10;
      (pbVar15->volume).mx.m_floats[2] = bVar11;
      (pbVar15->volume).mx.m_floats[3] = bVar12;
      bStack_58.m_size = bStack_58.m_size + -1;
      ppbVar16 = (btDbvtNode **)((long)(&pbVar4->volume + 1) + ((ulong)((uint)lVar17 & 1) + 1) * 8);
      if (pbVar4 == (btDbvtNode *)0x0) {
        ppbVar16 = (btDbvtNode **)__fn;
      }
      *ppbVar16 = pbVar15;
      if ((pbVar3->field_2).childs[1] == (btDbvtNode *)0x0) {
        (**(code **)(*local_38 + 0x10))(local_38,pbVar15);
      }
      else {
        pbVar4 = (pbVar3->field_2).childs[0];
        if (bStack_58.m_size == bStack_58.m_capacity) {
          iVar18 = bStack_58.m_size * 2;
          if (bStack_58.m_size == 0) {
            iVar18 = 1;
          }
          if (bStack_58.m_capacity < iVar18) {
            if (iVar18 == 0) {
              psVar14 = (sStkCLN *)0x0;
            }
            else {
              psVar14 = (sStkCLN *)btAlignedAllocInternal((long)iVar18 << 4,0x10);
            }
            if (0 < (long)bStack_58.m_size) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar17);
                uVar13 = puVar1[1];
                puVar2 = (undefined8 *)((long)&psVar14->node + lVar17);
                *puVar2 = *puVar1;
                puVar2[1] = uVar13;
                lVar17 = lVar17 + 0x10;
              } while ((long)bStack_58.m_size * 0x10 != lVar17);
            }
            if ((bStack_58.m_data != (sStkCLN *)0x0) && (bStack_58.m_ownsMemory == true)) {
              btAlignedFreeInternal(bStack_58.m_data);
            }
            bStack_58.m_ownsMemory = true;
            bStack_58.m_data = psVar14;
            bStack_58.m_capacity = iVar18;
          }
        }
        lVar17 = (long)bStack_58.m_size;
        bStack_58.m_size = bStack_58.m_size + 1;
        bStack_58.m_data[lVar17].node = pbVar4;
        bStack_58.m_data[lVar17].parent = pbVar15;
        pbVar3 = (pbVar3->field_2).childs[1];
        if (bStack_58.m_size == bStack_58.m_capacity) {
          iVar18 = bStack_58.m_size * 2;
          if (bStack_58.m_size == 0) {
            iVar18 = 1;
          }
          if (bStack_58.m_capacity < iVar18) {
            if (iVar18 == 0) {
              psVar14 = (sStkCLN *)0x0;
            }
            else {
              psVar14 = (sStkCLN *)btAlignedAllocInternal((long)iVar18 << 4,0x10);
            }
            if (0 < (long)bStack_58.m_size) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar17);
                uVar13 = puVar1[1];
                puVar2 = (undefined8 *)((long)&psVar14->node + lVar17);
                *puVar2 = *puVar1;
                puVar2[1] = uVar13;
                lVar17 = lVar17 + 0x10;
              } while ((long)bStack_58.m_size * 0x10 != lVar17);
            }
            if ((bStack_58.m_data != (sStkCLN *)0x0) && (bStack_58.m_ownsMemory == true)) {
              btAlignedFreeInternal(bStack_58.m_data);
            }
            bStack_58.m_ownsMemory = true;
            bStack_58.m_data = psVar14;
            bStack_58.m_capacity = iVar18;
          }
        }
        lVar17 = (long)bStack_58.m_size;
        bStack_58.m_size = bStack_58.m_size + 1;
        bStack_58.m_data[lVar17].node = pbVar3;
        bStack_58.m_data[lVar17].parent = pbVar15;
      }
    } while (0 < bStack_58.m_size);
    btAlignedObjectArray<btDbvt::sStkCLN>::~btAlignedObjectArray(&bStack_58);
    iVar18 = extraout_EAX_00;
  }
  return iVar18;
}

Assistant:

void			btDbvt::clone(btDbvt& dest,IClone* iclone) const
{
	dest.clear();
	if(m_root!=0)
	{	
		btAlignedObjectArray<sStkCLN>	stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root,0));
		do	{
			const int		i=stack.size()-1;
			const sStkCLN	e=stack[i];
			btDbvtNode*			n=createnode(&dest,e.parent,e.node->volume,e.node->data);
			stack.pop_back();
			if(e.parent!=0)
				e.parent->childs[i&1]=n;
			else
				dest.m_root=n;
			if(e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0],n));
				stack.push_back(sStkCLN(e.node->childs[1],n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while(stack.size()>0);
	}
}